

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateReset2(z_streamp strm,int windowBits)

{
  internal_state *piVar1;
  long lVar2;
  int iVar3;
  inflate_state *state;
  int wrap;
  int windowBits_local;
  z_streamp strm_local;
  
  iVar3 = inflateStateCheck(strm);
  if (iVar3 == 0) {
    piVar1 = strm->state;
    if (windowBits < 0) {
      state._0_4_ = 0;
      state._4_4_ = -windowBits;
    }
    else {
      state._0_4_ = (windowBits >> 4) + 5;
      state._4_4_ = windowBits;
      if (windowBits < 0x30) {
        state._4_4_ = windowBits & 0xf;
      }
    }
    if ((state._4_4_ == 0) || ((7 < (int)state._4_4_ && ((int)state._4_4_ < 0x10)))) {
      lVar2._0_1_ = piVar1->method;
      lVar2._1_3_ = *(undefined3 *)&piVar1->field_0x49;
      lVar2._4_4_ = piVar1->last_flush;
      if ((lVar2 != 0) && (*(uint *)&piVar1->gzhead != state._4_4_)) {
        (*strm->zfree)(strm->opaque,*(voidpf *)&piVar1->method);
        piVar1->method = '\0';
        *(undefined3 *)&piVar1->field_0x49 = 0;
        piVar1->last_flush = 0;
      }
      *(int *)&piVar1->pending_buf = (int)state;
      *(uint *)&piVar1->gzhead = state._4_4_;
      strm_local._4_4_ = cm_zlib_inflateReset(strm);
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateReset2(strm, windowBits)
z_streamp strm;
int windowBits;
{
    int wrap;
    struct inflate_state FAR *state;

    /* get the state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        wrap = 0;
        windowBits = -windowBits;
    }
    else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= 15;
#endif
    }

    /* set number of window bits, free window if different */
    if (windowBits && (windowBits < 8 || windowBits > 15))
        return Z_STREAM_ERROR;
    if (state->window != Z_NULL && state->wbits != (unsigned)windowBits) {
        ZFREE(strm, state->window);
        state->window = Z_NULL;
    }

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return inflateReset(strm);
}